

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# router.h
# Opt level: O2

type * __thiscall
rest_rpc::rpc_service::router::
call_helper<std::__cxx11::string(*)(std::weak_ptr<rest_rpc::rpc_service::connection>,person_const&),0ul,person>
          (type *__return_storage_ptr__,router *this,
          _func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_weak_ptr<rest_rpc::rpc_service::connection>_person_ptr
          **f,index_sequence<0UL> *param_2,tuple<person> *tup,
          weak_ptr<rest_rpc::rpc_service::connection> *ptr)

{
  __buckets_ptr pp_Var1;
  __weak_ptr<rest_rpc::rpc_service::connection,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  pp_Var1 = (this->map_invokers_)._M_h._M_buckets;
  std::__weak_ptr<rest_rpc::rpc_service::connection,_(__gnu_cxx::_Lock_policy)2>::__weak_ptr
            (&local_30,
             (__weak_ptr<rest_rpc::rpc_service::connection,_(__gnu_cxx::_Lock_policy)2> *)tup);
  (*(code *)pp_Var1)(__return_storage_ptr__,&local_30,param_2);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_30._M_refcount);
  return __return_storage_ptr__;
}

Assistant:

static typename std::result_of<F(std::weak_ptr<connection>, Args...)>::type
  call_helper(const F &f, const nonstd::index_sequence<I...> &,
              std::tuple<Args...> tup, std::weak_ptr<connection> ptr) {
    return f(ptr, std::move(std::get<I>(tup))...);
  }